

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<true,duckdb::interval_t,duckdb::NotEquals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  int iVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  unsigned_long *puVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  const_reference pvVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  interval_t *lhs_data;
  idx_t local_80;
  idx_t local_70;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = (lhs_format->unified).sel;
    pdVar2 = (lhs_format->unified).data;
    pdVar4 = rhs_row_locations->data;
    pvVar12 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar12;
      local_70 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar3->sel_vector;
      local_80 = 0;
      uVar15 = 0;
      do {
        uVar17 = uVar15;
        if (psVar6 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar6[uVar15];
        }
        uVar13 = uVar17;
        if (psVar7 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar7[uVar17];
        }
        lVar9 = *(long *)(pdVar4 + uVar17 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar9 + (col_idx >> 3))) == 0) {
LAB_012925f2:
          *no_match_count = local_70 + 1;
          no_match_sel->sel_vector[local_70] = (sel_t)uVar17;
          local_70 = local_70 + 1;
        }
        else {
          lVar10 = *(long *)(lVar9 + 8 + vVar5);
          uVar11 = *(undefined8 *)(lVar9 + vVar5);
          lVar14 = uVar13 * 0x10;
          iVar19 = (int)((ulong)uVar11 >> 0x20);
          iVar1 = *(int *)(pdVar2 + lVar14 + 4);
          lVar9 = *(long *)(pdVar2 + lVar14 + 8);
          iVar18 = (int)uVar11;
          if (((*(int *)(pdVar2 + lVar14) == iVar18) && (iVar1 == iVar19)) &&
             (iVar19 = iVar1, lVar9 == lVar10)) goto LAB_012925f2;
          lVar16 = (long)iVar1 + lVar9 / 86400000000;
          lVar20 = (long)iVar19 + lVar10 / 86400000000;
          if ((((long)*(int *)(pdVar2 + lVar14) + lVar16 / 0x1e == (long)iVar18 + lVar20 / 0x1e) &&
              (lVar16 % 0x1e == lVar20 % 0x1e)) && (lVar9 % 86400000000 == lVar10 % 86400000000))
          goto LAB_012925f2;
          psVar6[local_80] = (sel_t)uVar17;
          local_80 = local_80 + 1;
        }
        uVar15 = uVar15 + 1;
        if (count == uVar15) {
          return local_80;
        }
      } while( true );
    }
  }
  else {
    pdVar2 = rhs_row_locations->data;
    pSVar3 = (lhs_format->unified).sel;
    pdVar4 = (lhs_format->unified).data;
    pvVar12 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar12;
      local_70 = *no_match_count;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar3->sel_vector;
      puVar8 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      local_80 = 0;
      uVar15 = 0;
      do {
        uVar17 = uVar15;
        if (psVar6 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar6[uVar15];
        }
        uVar13 = uVar17;
        if (psVar7 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar7[uVar17];
        }
        if (puVar8 == (unsigned_long *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (puVar8[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0;
        }
        if ((bVar21) ||
           (lVar9 = *(long *)(pdVar2 + uVar17 * 8),
           ((uint)*(byte *)(lVar9 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7)) == 0)) {
LAB_012923fc:
          *no_match_count = local_70 + 1;
          no_match_sel->sel_vector[local_70] = (sel_t)uVar17;
          local_70 = local_70 + 1;
        }
        else {
          lVar10 = *(long *)(lVar9 + 8 + vVar5);
          uVar11 = *(undefined8 *)(lVar9 + vVar5);
          lVar14 = uVar13 * 0x10;
          iVar19 = (int)((ulong)uVar11 >> 0x20);
          iVar1 = *(int *)(pdVar4 + lVar14 + 4);
          lVar9 = *(long *)(pdVar4 + lVar14 + 8);
          iVar18 = (int)uVar11;
          if ((*(int *)(pdVar4 + lVar14) == iVar18) &&
             ((iVar1 == iVar19 && (iVar19 = iVar1, lVar9 == lVar10)))) goto LAB_012923fc;
          lVar16 = (long)iVar1 + lVar9 / 86400000000;
          lVar20 = (long)iVar19 + lVar10 / 86400000000;
          if (((long)*(int *)(pdVar4 + lVar14) + lVar16 / 0x1e == (long)iVar18 + lVar20 / 0x1e) &&
             ((lVar16 % 0x1e == lVar20 % 0x1e && (lVar9 % 86400000000 == lVar10 % 86400000000))))
          goto LAB_012923fc;
          psVar6[local_80] = (sel_t)uVar17;
          local_80 = local_80 + 1;
        }
        uVar15 = uVar15 + 1;
        if (count == uVar15) {
          return local_80;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}